

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_145302::DirectoryInputNodeTask::provideValue
          (DirectoryInputNodeTask *this,TaskInterface ti,uintptr_t inputID,KeyType *key,
          ValueType *valueData)

{
  undefined1 local_a8 [8];
  BuildValue value;
  ValueType *valueData_local;
  KeyType *key_local;
  uintptr_t inputID_local;
  DirectoryInputNodeTask *this_local;
  TaskInterface ti_local;
  
  value.stringValues.size = (uint64_t)valueData;
  if (inputID == 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->directorySignature,valueData);
  }
  else {
    llbuild::buildsystem::BuildValue::fromData((BuildValue *)local_a8,valueData);
    this->finishedBlockingDeps = this->finishedBlockingDeps + 1;
    if (this->finishedBlockingDeps == this->totalBlockingDeps) {
      performUnblockedRequest(this,ti);
    }
    llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)local_a8);
  }
  return;
}

Assistant:

virtual void provideValue(TaskInterface ti, uintptr_t inputID,
                            const KeyType& key, const ValueType& valueData) override {
    if (inputID == 0) {
      directorySignature = valueData;
    } else {
      auto value = BuildValue::fromData(valueData);

      ++finishedBlockingDeps;
      if (finishedBlockingDeps == totalBlockingDeps) {
        // All paths within mustScanAfterPaths are scanned..
        // DirectoryTreeSignature is unblocked
        performUnblockedRequest(ti);
      }
    }
  }